

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_rshl_s32_arm(uint32_t valop,uint32_t shiftop)

{
  byte bVar1;
  int64_t big_dest;
  uint32_t uStack_14;
  int8_t shift;
  int32_t val;
  int32_t dest;
  uint32_t shiftop_local;
  uint32_t valop_local;
  
  bVar1 = (byte)shiftop;
  if (((char)bVar1 < ' ') && (-0x20 < (char)bVar1)) {
    if ((char)bVar1 < '\0') {
      uStack_14 = (uint32_t)((long)(int)valop + (1L << (-bVar1 - 1 & 0x3f)) >> (-bVar1 & 0x3f));
    }
    else {
      uStack_14 = valop << (bVar1 & 0x1f);
    }
  }
  else {
    uStack_14 = 0;
  }
  return uStack_14;
}

Assistant:

uint32_t HELPER(neon_rshl_s32)(uint32_t valop, uint32_t shiftop)
{
    int32_t dest;
    int32_t val = (int32_t)valop;
    int8_t shift = (int8_t)shiftop;
    if ((shift >= 32) || (shift <= -32)) {
        dest = 0;
    } else if (shift < 0) {
        int64_t big_dest = ((int64_t)val + (1ULL << (-1 - shift)));
        dest = big_dest >> -shift;
    } else {
        dest = val << shift;
    }
    return dest;
}